

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__get16le(stbi__context *s)

{
  byte bVar1;
  byte bVar2;
  int z;
  stbi__context *s_local;
  
  bVar1 = stbi__get8(s);
  bVar2 = stbi__get8(s);
  return (uint)bVar1 + (uint)bVar2 * 0x100;
}

Assistant:

static int stbi__get16le(stbi__context *s)
{
   int z = stbi__get8(s);
   return z + (stbi__get8(s) << 8);
}